

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O1

void xio_destroy(XIO_HANDLE xio)

{
  if (xio != (XIO_HANDLE)0x0) {
    (*xio->io_interface_description->concrete_io_destroy)(xio->concrete_xio_handle);
    free(xio);
    return;
  }
  return;
}

Assistant:

void xio_destroy(XIO_HANDLE xio)
{
    /* Codes_SRS_XIO_01_007: [If the argument io is NULL, xio_destroy shall do nothing.] */
    if (xio != NULL)
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;

        /* Codes_SRS_XIO_01_006: [xio_destroy shall also call the concrete_io_destroy function that is member of the io_interface_description argument passed to xio_create, while passing as argument to concrete_io_destroy the result of the underlying concrete_io_create handle that was called as part of the xio_create call.] */
        xio_instance->io_interface_description->concrete_io_destroy(xio_instance->concrete_xio_handle);

        /* Codes_SRS_XIO_01_005: [xio_destroy shall free all resources associated with the IO handle.] */
        free(xio_instance);
    }
}